

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFF_Layer3Interrogator.cpp
# Opt level: O2

void __thiscall
KDIS::DATA_TYPE::IFF_Layer3Interrogator::Decode
          (IFF_Layer3Interrogator *this,KDataStream *stream,bool ignoreHeader)

{
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
  *this_00;
  KUINT16 KVar1;
  KException *this_01;
  ushort uVar2;
  KUINT16 *T;
  allocator<char> local_49;
  KString local_48;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  if (0x1b < KVar1) {
    this_00 = &(this->super_IFF_Layer3).m_vStdVarRecs;
    std::
    vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
    ::clear(this_00);
    if (!ignoreHeader) {
      LayerHeader::Decode((LayerHeader *)this,stream);
    }
    (*(this->super_IFF_Layer3).m_RptSim.super_DataTypeBase._vptr_DataTypeBase[3])
              (&(this->super_IFF_Layer3).m_RptSim,stream);
    (*(this->m_BasicData).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_BasicData,stream);
    KDataStream::Read<unsigned_short>(stream,&(this->super_IFF_Layer3).m_ui16Padding);
    T = &(this->super_IFF_Layer3).m_ui16NumIffRecs;
    KDataStream::Read<unsigned_short>(stream,T);
    for (uVar2 = 0; uVar2 < *T; uVar2 = uVar2 + 1) {
      StandardVariable::FactoryDecodeStandardVariable((StdVarPtr *)&local_48,stream);
      std::
      vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>>>
      ::emplace_back<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>>
                ((vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>>>
                  *)this_00,(KRef_Ptr<KDIS::DATA_TYPE::StandardVariable> *)&local_48);
      UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>::~KRef_Ptr
                ((KRef_Ptr<KDIS::DATA_TYPE::StandardVariable> *)&local_48);
    }
    return;
  }
  this_01 = (KException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"Decode",&local_49);
  KException::KException(this_01,&local_48,2);
  __cxa_throw(this_01,&KException::typeinfo,KException::~KException);
}

Assistant:

void IFF_Layer3Interrogator::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( stream.GetBufferSize() < IFF_LAYER3_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    m_vStdVarRecs.clear();

	if( !ignoreHeader )
	{
		LayerHeader::Decode( stream );
	}

	stream >> KDIS_STREAM m_RptSim
		   >> KDIS_STREAM m_BasicData
		   >> m_ui16Padding
		   >> m_ui16NumIffRecs;

	// Use the factory decode function for each standard variable
    for( KUINT16 i = 0; i < m_ui16NumIffRecs; ++i )
    {
        m_vStdVarRecs.push_back( StandardVariable::FactoryDecodeStandardVariable( stream ) );
    }
}